

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O3

void __thiscall TLeonardoHeap<double>::insertion_sort(TLeonardoHeap<double> *this,size_t element)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  double tmp;
  double dVar14;
  
  uVar5 = this->tree_vector;
  if ((~(uint)uVar5 & 3) == 0) {
    sVar9 = uVar5 >> 2 | 1;
    this->tree_vector = sVar9;
    uVar4 = *(int *)&this->first_tree + 2;
    this->first_tree = (unsigned_short)uVar4;
    uVar5 = (ulong)(uVar4 & 0xffff);
  }
  else if (this->first_tree == 1) {
    sVar9 = uVar5 * 2 + 1;
    this->tree_vector = sVar9;
    this->first_tree = 0;
    uVar5 = 0;
  }
  else {
    sVar9 = uVar5 << ((char)this->first_tree - 1U & 0x3f) | 1;
    this->tree_vector = sVar9;
    this->first_tree = 1;
    uVar5 = 1;
  }
  uVar6 = Leonardo_k[uVar5];
  if (uVar6 <= element) {
    pdVar7 = this->data;
    uVar3 = this->N;
    uVar1 = uVar3 + 1;
    dVar14 = pdVar7[element];
    uVar11 = 2;
    while( true ) {
      uVar8 = element - uVar6;
      dVar2 = pdVar7[uVar8];
      if (dVar2 <= dVar14) break;
      if ((1 < uVar5) &&
         ((dVar2 < pdVar7[element - 1] || dVar2 == pdVar7[element - 1] ||
          (dVar2 < pdVar7[(element - 1) -
                          *(long *)("basic_string::_M_construct null not valid" + uVar5 * 8 + 0x23)]
           || dVar2 == pdVar7[(element - 1) -
                              *(long *)("basic_string::_M_construct null not valid" +
                                       uVar5 * 8 + 0x23)])))) goto LAB_00103709;
      pdVar7[element] = dVar2;
      pdVar7[uVar8] = dVar14;
      uVar5 = uVar5 + 1;
      uVar6 = uVar5;
      uVar12 = uVar11;
      if (uVar5 < uVar1) {
        do {
          uVar11 = uVar12 * 2;
          uVar5 = uVar6;
          if ((uVar12 & sVar9) != 0) break;
          bVar13 = uVar6 != uVar3;
          uVar5 = uVar1;
          uVar6 = uVar6 + 1;
          uVar12 = uVar11;
        } while (bVar13);
      }
      uVar6 = Leonardo_k[uVar5];
      element = uVar8;
      if (uVar8 < uVar6) break;
    }
  }
  if (1 < uVar5) {
    pdVar7 = this->data;
    dVar14 = pdVar7[element];
LAB_00103709:
    do {
      sVar10 = (element - 1) -
               *(long *)("basic_string::_M_construct null not valid" + uVar5 * 8 + 0x23);
      sVar9 = element - 1;
      if (pdVar7[element - 1] <= pdVar7[sVar10]) {
        sVar9 = sVar10;
      }
      if (pdVar7[sVar9] <= dVar14) {
        return;
      }
      if (pdVar7[sVar10] < pdVar7[element - 1]) {
        uVar5 = uVar5 - 2;
      }
      else {
        uVar5 = uVar5 - 1;
      }
      pdVar7[element] = pdVar7[sVar9];
      pdVar7[sVar9] = dVar14;
      element = sVar9;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::insertion_sort(size_t element) {
	if((tree_vector & 1) && (tree_vector & 2)) {	// Smallest two trees are of sequential order
		// Insert a tree of order L_{k+2} with the new element as the root
		tree_vector = (tree_vector >> 2) | 1;
		first_tree += 2;
	} else if(first_tree == 1) {
		// Insert a singleton node of order L_0
		tree_vector = (tree_vector << 1) | 1;
		first_tree = 0;
	} else {
		// Insert a singleton node of order L_1
		tree_vector = (tree_vector << (first_tree-1)) | 1;
		first_tree = 1;
	}
	// Filter leftwards to restore ascending root and max-heap properties
	filter(element, first_tree);
}